

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::immediate
               (AccessType param_1,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  AccessType param_0_local;
  
  if (!is8bit) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  }
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationCopyInstructionToData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void immediate(AccessType, bool is8bit, const std::function<void(MicroOp)> &target) {
		if(!is8bit) target(CycleFetchIncrementPC);	// IDL.
		target(CycleFetchIncrementPC);				// ID [H].
		target(OperationCopyInstructionToData);
		target(OperationPerform);
	}